

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangeproof_impl.h
# Opt level: O3

int secp256k1_bulletproof_rangeproof_verify_impl
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_scratch *scratch,uchar **proof,
              size_t n_proofs,size_t plen,size_t nbits,uint64_t **min_value,secp256k1_ge **commitp,
              size_t n_commits,secp256k1_ge *value_gen,secp256k1_bulletproof_generators *gens,
              uchar **extra_commit,size_t *extra_commit_len)

{
  ulong uVar1;
  undefined8 *puVar2;
  secp256k1_ge *r_00;
  secp256k1_ge *r_01;
  byte bVar3;
  bool bVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  int iVar8;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  undefined4 extraout_EAX_03;
  undefined4 extraout_EAX_04;
  undefined4 extraout_EAX_05;
  size_t ret;
  long lVar9;
  uint64_t *puVar10;
  ulong uVar11;
  long lVar12;
  size_t sVar13;
  uint uVar14;
  size_t sVar15;
  void *pvVar16;
  secp256k1_sha256 *psVar17;
  secp256k1_scalar *psVar18;
  uint64_t *puVar19;
  secp256k1_scalar *r_02;
  size_t sVar20;
  secp256k1_scalar *psVar21;
  long lVar22;
  void *pvVar23;
  secp256k1_scratch *psVar24;
  size_t sVar25;
  uchar *puVar26;
  secp256k1_gej *r_03;
  ulong uVar27;
  uint64_t uVar28;
  bool bVar29;
  byte bVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int overflow;
  uchar commit [32];
  secp256k1_scalar taux;
  secp256k1_scalar mu;
  uchar vbuf [8];
  secp256k1_gej r;
  secp256k1_ge sge;
  uchar randomizer61 [32];
  secp256k1_ge age;
  undefined4 local_32c;
  secp256k1_scratch *local_328;
  byte local_319;
  void *local_318;
  secp256k1_scalar *local_310;
  uint64_t *local_308;
  void *local_300;
  secp256k1_scalar *local_2f8;
  size_t local_2f0;
  ulong local_2e8;
  undefined8 local_2e0;
  uint64_t local_2d8;
  size_t local_2d0;
  size_t local_2c8;
  secp256k1_scalar *local_2c0;
  secp256k1_scalar local_2b8;
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined8 local_270;
  secp256k1_scalar local_268;
  long local_240;
  secp256k1_scalar local_238;
  undefined1 local_218 [48];
  secp256k1_gej local_1e8;
  long local_160;
  secp256k1_scalar *local_158;
  long local_150;
  ulong local_148;
  void *local_140;
  secp256k1_scalar *local_138;
  long local_130;
  secp256k1_ecmult_context *local_128;
  undefined1 local_120 [16];
  uint64_t uStack_110;
  uint64_t local_108;
  uint64_t uStack_100;
  secp256k1_ge *local_f8;
  secp256k1_ge *local_f0;
  secp256k1_ge *local_e8;
  size_t local_e0;
  secp256k1_scalar *local_d8;
  int local_d0;
  void *local_c8;
  void *local_c0;
  undefined1 local_b8 [32];
  secp256k1_sha256 local_98;
  
  bVar30 = 0;
  lVar12 = 0x40;
  lVar9 = 0;
  sVar13 = nbits;
  do {
    lVar9 = lVar9 + (ulong)((uint)sVar13 & 1);
    sVar13 = sVar13 >> 1;
    lVar12 = lVar12 + -1;
  } while (lVar12 != 0);
  if (plen - 0x528 < 0xfffffffffffffbb9) {
    return 0;
  }
  if (0x40 < nbits) {
    return 0;
  }
  if (lVar9 != 1) {
    return 0;
  }
  local_310 = (secp256k1_scalar *)proof;
  iVar8 = secp256k1_scratch_allocate_frame(scratch,n_proofs * 0x370,2);
  if (iVar8 == 0) {
    return 0;
  }
  sVar13 = scratch->frame;
  local_2f0 = plen;
  if (sVar13 == 0) {
    local_300 = (void *)0x0;
LAB_0010f80a:
    local_318 = (void *)0x0;
  }
  else {
    sVar25 = n_proofs * 0x2f0;
    if ((void *)scratch->offset[sVar13 + 4] < (void *)((long)scratch->data[sVar13 + 4] + sVar25)) {
      local_300 = (void *)0x0;
LAB_0010f7f3:
      lVar9 = sVar13 - 1;
      sVar25 = n_proofs * 0x80;
      if (scratch->frame_size[lVar9] < scratch->offset[lVar9] + sVar25) goto LAB_0010f80a;
      local_318 = (void *)(scratch->offset[lVar9] + (long)scratch->data[lVar9]);
      memset(local_318,0,sVar25);
      scratch->offset[lVar9] = scratch->offset[lVar9] + sVar25;
    }
    else {
      local_300 = (void *)((long)scratch->data[sVar13 + 4] + (long)scratch->data[sVar13 - 1]);
      local_318 = (void *)0x0;
      memset(local_300,0,sVar25);
      scratch->data[sVar13 + 4] = (void *)((long)scratch->data[sVar13 + 4] + sVar25);
      sVar13 = scratch->frame;
      if (sVar13 != 0) goto LAB_0010f7f3;
    }
  }
  local_328 = scratch;
  local_2c8 = n_proofs;
  local_128 = ecmult_ctx;
  if (n_proofs < 2) {
    local_308._0_4_ = 1;
    if (n_proofs != 0) goto LAB_0010f96c;
    uVar28 = n_commits * nbits;
    local_308._0_4_ = 1;
    bVar4 = true;
  }
  else {
    lVar9 = n_proofs - 1;
    puVar10 = value_gen[1].y.n + 4;
    local_308._0_4_ = 1;
    do {
      local_1e8.x.n[0] = (puVar10[-0x14] - puVar10[-9]) + 0x3ffffbfffff0bc;
      local_1e8.x.n[1] = (puVar10[-0x13] - puVar10[-8]) + 0x3ffffffffffffc;
      local_1e8.x.n[2] = (puVar10[-0x12] - puVar10[-7]) + 0x3ffffffffffffc;
      local_1e8.x.n[3] = (puVar10[-0x11] - puVar10[-6]) + 0x3ffffffffffffc;
      local_1e8.x.n[4] = (puVar10[-0x10] - puVar10[-5]) + 0x3fffffffffffc;
      iVar8 = secp256k1_fe_normalizes_to_zero_var(&local_1e8.x);
      if (iVar8 == 0) {
LAB_0010f944:
        local_308._0_4_ = 0;
      }
      else {
        local_1e8.x.n[0] =
             (puVar10[-0xf] - ((secp256k1_fe *)(puVar10 + -4))->n[0]) + 0x3ffffbfffff0bc;
        local_1e8.x.n[1] = (puVar10[-0xe] - puVar10[-3]) + 0x3ffffffffffffc;
        local_1e8.x.n[2] = (puVar10[-0xd] - puVar10[-2]) + 0x3ffffffffffffc;
        local_1e8.x.n[3] = (puVar10[-0xc] - puVar10[-1]) + 0x3ffffffffffffc;
        local_1e8.x.n[4] = (puVar10[-0xb] - *puVar10) + 0x3fffffffffffc;
        iVar8 = secp256k1_fe_normalizes_to_zero_var(&local_1e8.x);
        if (iVar8 == 0) goto LAB_0010f944;
      }
      puVar10 = puVar10 + 0xb;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
LAB_0010f96c:
    local_270 = (secp256k1_scalar *)
                (CONCAT44(local_270._4_4_,(int)(n_commits >> 8)) & 0xffffffff00ffffff);
    local_278 = CONCAT44(local_278._4_4_,(int)(n_commits >> 0x10)) & 0xffffffff0000ffff;
    local_2e0 = CONCAT44(local_2e0._4_4_,(int)(n_commits >> 0x18)) & 0xffffffff000000ff;
    local_2d8 = n_commits * nbits;
    local_2e8 = n_commits + 5;
    sVar13 = 0;
    local_2d0 = nbits;
    do {
      local_288 = (undefined1  [16])0x0;
      local_298 = (undefined1  [16])0x0;
      local_b8._16_16_ = (undefined1  [16])0x0;
      local_b8._0_16_ = (undefined1  [16])0x0;
      if ((min_value != (uint64_t **)0x0) && (min_value[sVar13] != (uint64_t *)0x0)) {
        local_1e8.x.n[0] = 0xbb67ae856a09e667;
        local_1e8.x.n[1] = 0xa54ff53a3c6ef372;
        local_1e8.x.n[2] = 0x9b05688c510e527f;
        local_1e8.x.n[3] = 0x5be0cd191f83d9ab;
        local_1e8.z.n[2] = 0;
        secp256k1_sha256_write((secp256k1_sha256 *)&local_1e8,local_298,0x20);
        local_32c = CONCAT13((char)local_2e0,
                             CONCAT12((char)local_278,CONCAT11((char)local_270,(char)n_commits)));
        secp256k1_sha256_write((secp256k1_sha256 *)&local_1e8,(uchar *)&local_32c,4);
        if (n_commits != 0) {
          sVar15 = 0;
          do {
            local_218._0_8_ = min_value[sVar13][sVar15];
            secp256k1_sha256_write((secp256k1_sha256 *)&local_1e8,local_218,8);
            sVar15 = sVar15 + 1;
          } while (n_commits != sVar15);
        }
        secp256k1_sha256_finalize((secp256k1_sha256 *)&local_1e8,local_298);
      }
      if (n_commits != 0) {
        lVar9 = 0;
        sVar15 = n_commits;
        do {
          secp256k1_bulletproof_update_commit
                    (local_298,(secp256k1_ge *)((long)(commitp[sVar13]->x).n + lVar9),
                     value_gen + sVar13);
          lVar9 = lVar9 + 0x58;
          sVar15 = sVar15 - 1;
        } while (sVar15 != 0);
      }
      if ((extra_commit != (uchar **)0x0) && (extra_commit[sVar13] != (uchar *)0x0)) {
        local_1e8.x.n[0] = 0xbb67ae856a09e667;
        local_1e8.x.n[1] = 0xa54ff53a3c6ef372;
        local_1e8.x.n[2] = 0x9b05688c510e527f;
        local_1e8.x.n[3] = 0x5be0cd191f83d9ab;
        local_1e8.z.n[2] = 0;
        secp256k1_sha256_write((secp256k1_sha256 *)&local_1e8,local_298,0x20);
        secp256k1_sha256_write
                  ((secp256k1_sha256 *)&local_1e8,extra_commit[sVar13],extra_commit_len[sVar13]);
        secp256k1_sha256_finalize((secp256k1_sha256 *)&local_1e8,local_298);
      }
      puVar26 = (uchar *)local_310->d[sVar13];
      secp256k1_fe_set_b32((secp256k1_fe *)local_218,puVar26 + 0x41);
      iVar8 = secp256k1_ge_set_xquad((secp256k1_ge *)&local_98,(secp256k1_fe *)local_218);
      if (iVar8 == 0) {
        return 0;
      }
      bVar3 = puVar26[0x40];
      if ((bVar3 & 1) != 0) {
        secp256k1_ge_neg((secp256k1_ge *)&local_98,(secp256k1_ge *)&local_98);
      }
      secp256k1_fe_set_b32((secp256k1_fe *)local_218,puVar26 + 0x61);
      iVar8 = secp256k1_ge_set_xquad((secp256k1_ge *)local_120,(secp256k1_fe *)local_218);
      if (iVar8 == 0) {
        return 0;
      }
      if ((bVar3 & 2) != 0) {
        secp256k1_ge_neg((secp256k1_ge *)local_120,(secp256k1_ge *)local_120);
      }
      secp256k1_bulletproof_update_commit
                (local_298,(secp256k1_ge *)&local_98,(secp256k1_ge *)local_120);
      pvVar23 = local_300;
      lVar9 = sVar13 * 0x2f0;
      psVar18 = (secp256k1_scalar *)((long)local_300 + lVar9 + 0x1e0);
      secp256k1_scalar_set_b32(psVar18,local_298,(int *)&local_2b8);
      if (((int)local_2b8.d[0] != 0) ||
         (auVar33._0_4_ =
               -(uint)(*(int *)((long)pvVar23 + lVar9 + 0x1f0) == 0 && (int)psVar18->d[0] == 0),
         auVar33._4_4_ =
              -(uint)(*(int *)((long)pvVar23 + lVar9 + 500) == 0 &&
                     *(int *)((long)pvVar23 + lVar9 + 0x1e4) == 0),
         auVar33._8_4_ =
              -(uint)(*(int *)((long)pvVar23 + lVar9 + 0x1f8) == 0 &&
                     *(int *)((long)pvVar23 + lVar9 + 0x1e8) == 0),
         auVar33._12_4_ =
              -(uint)(*(int *)((long)pvVar23 + lVar9 + 0x1fc) == 0 &&
                     *(int *)((long)pvVar23 + lVar9 + 0x1ec) == 0),
         iVar8 = movmskps(extraout_EAX,auVar33), iVar8 == 0xf)) {
LAB_00110214:
        sVar13 = local_328->frame;
        local_328->frame = sVar13 - 1;
        free(local_328->data[sVar13 - 1]);
        return 0;
      }
      r_02 = (secp256k1_scalar *)(lVar9 + (long)pvVar23);
      secp256k1_bulletproof_update_commit
                (local_298,(secp256k1_ge *)&local_98,(secp256k1_ge *)local_120);
      psVar21 = r_02 + 2;
      secp256k1_scalar_set_b32(psVar21,local_298,(int *)&local_2b8);
      if (((int)local_2b8.d[0] != 0) ||
         (auVar34._0_4_ = -(uint)((int)r_02[2].d[2] == 0 && (int)psVar21->d[0] == 0),
         auVar34._4_4_ =
              -(uint)(*(int *)((long)r_02[2].d + 0x14) == 0 && *(int *)((long)r_02[2].d + 4) == 0),
         auVar34._8_4_ = -(uint)((int)r_02[2].d[3] == 0 && (int)r_02[2].d[1] == 0),
         auVar34._12_4_ =
              -(uint)(*(int *)((long)r_02[2].d + 0x1c) == 0 && *(int *)((long)r_02[2].d + 0xc) == 0)
         , iVar8 = movmskps(extraout_EAX_00,auVar34), iVar8 == 0xf)) goto LAB_00110214;
      r_00 = (secp256k1_ge *)(r_02 + 0x12);
      puVar26 = (uchar *)local_310->d[sVar13];
      local_2f8 = psVar18;
      secp256k1_fe_set_b32((secp256k1_fe *)local_218,puVar26 + 0x81);
      iVar8 = secp256k1_ge_set_xquad(r_00,(secp256k1_fe *)local_218);
      if (iVar8 == 0) {
        return 0;
      }
      local_2c0 = psVar21;
      if ((puVar26[0x40] & 4) != 0) {
        secp256k1_ge_neg(r_00,r_00);
      }
      r_01 = (secp256k1_ge *)(r_02[0x14].d + 3);
      puVar26 = (uchar *)local_310->d[sVar13];
      secp256k1_fe_set_b32((secp256k1_fe *)local_218,puVar26 + 0xa1);
      iVar8 = secp256k1_ge_set_xquad(r_01,(secp256k1_fe *)local_218);
      if (iVar8 == 0) {
        return 0;
      }
      if ((puVar26[0x40] & 8) != 0) {
        secp256k1_ge_neg(r_01,r_01);
      }
      secp256k1_bulletproof_update_commit(local_298,r_00,r_01);
      secp256k1_scalar_set_b32(r_02 + 7,local_298,(int *)&local_2b8);
      sVar15 = local_2d0;
      if (((int)local_2b8.d[0] != 0) ||
         (auVar35._0_4_ = -(uint)((int)r_02[7].d[2] == 0 && (int)r_02[7].d[0] == 0),
         auVar35._4_4_ =
              -(uint)(*(int *)((long)r_02[7].d + 0x14) == 0 && *(int *)((long)r_02[7].d + 4) == 0),
         auVar35._8_4_ = -(uint)((int)r_02[7].d[3] == 0 && (int)r_02[7].d[1] == 0),
         auVar35._12_4_ =
              -(uint)(*(int *)((long)r_02[7].d + 0x1c) == 0 && *(int *)((long)r_02[7].d + 0xc) == 0)
         , iVar8 = movmskps(extraout_EAX_01,auVar35), iVar8 == 0xf)) goto LAB_00110214;
      secp256k1_scalar_inverse(r_02,local_2f8);
      uVar28 = r_02->d[0];
      uVar5 = r_02->d[1];
      uVar6 = r_02->d[3];
      r_02[1].d[2] = r_02->d[2];
      r_02[1].d[3] = uVar6;
      r_02[1].d[0] = uVar28;
      r_02[1].d[1] = uVar5;
      uVar27 = 0;
      while( true ) {
        psVar18 = local_2c0;
        if (sVar15 < 9) {
          uVar11 = *(ulong *)(&DAT_0012f4a0 + sVar15 * 8);
        }
        else {
          uVar11 = 0;
          sVar20 = sVar15;
          do {
            uVar11 = uVar11 + 1;
            bVar4 = 3 < sVar20;
            sVar20 = sVar20 >> 1;
          } while (bVar4);
        }
        if (uVar11 <= uVar27) break;
        secp256k1_scalar_sqr(r_02 + 1,r_02 + 1);
        uVar27 = uVar27 + 1;
      }
      secp256k1_scalar_sqr(r_02 + 4,local_2c0);
      secp256k1_scalar_negate(r_02 + 6,psVar18);
      local_1e8.x.n[0] = 0xbb67ae856a09e667;
      local_1e8.x.n[1] = 0xa54ff53a3c6ef372;
      local_1e8.x.n[2] = 0x9b05688c510e527f;
      local_1e8.x.n[3] = 0x5be0cd191f83d9ab;
      local_1e8.z.n[2] = 0;
      secp256k1_sha256_write((secp256k1_sha256 *)&local_1e8,local_298,0x20);
      secp256k1_sha256_write((secp256k1_sha256 *)&local_1e8,(uchar *)local_310->d[sVar13],0x40);
      secp256k1_sha256_finalize((secp256k1_sha256 *)&local_1e8,local_298);
      local_1e8.x.n[0] = 0xbb67ae856a09e667;
      local_1e8.x.n[1] = 0xa54ff53a3c6ef372;
      local_1e8.x.n[2] = 0x9b05688c510e527f;
      local_1e8.x.n[3] = 0x5be0cd191f83d9ab;
      local_1e8.z.n[2] = 0;
      secp256k1_sha256_write((secp256k1_sha256 *)&local_1e8,local_298,0x20);
      secp256k1_sha256_finalize((secp256k1_sha256 *)&local_1e8,local_b8);
      psVar18 = r_02 + 0xe;
      secp256k1_scalar_set_b32(psVar18,local_b8,(int *)&local_2b8);
      if (((int)local_2b8.d[0] != 0) ||
         (auVar36._0_4_ = -(uint)((int)r_02[0xe].d[2] == 0 && (int)psVar18->d[0] == 0),
         auVar36._4_4_ =
              -(uint)(*(int *)((long)r_02[0xe].d + 0x14) == 0 &&
                     *(int *)((long)r_02[0xe].d + 4) == 0),
         auVar36._8_4_ = -(uint)((int)r_02[0xe].d[3] == 0 && (int)r_02[0xe].d[1] == 0),
         auVar36._12_4_ =
              -(uint)(*(int *)((long)r_02[0xe].d + 0x1c) == 0 &&
                     *(int *)((long)r_02[0xe].d + 0xc) == 0),
         iVar8 = movmskps(extraout_EAX_02,auVar36), iVar8 == 0xf)) goto LAB_00110214;
      puVar26 = (uchar *)local_310->d[sVar13];
      secp256k1_scalar_set_b32(&local_268,puVar26,(int *)&local_2b8);
      if (((int)local_2b8.d[0] != 0) ||
         ((((local_268.d[3] == 0 && local_268.d[1] == 0) &&
            (local_268.d[2] == 0 && local_268.d[0] == 0) ||
           (secp256k1_scalar_set_b32(&local_238,puVar26 + 0x20,(int *)&local_2b8),
           (int)local_2b8.d[0] != 0)) ||
          ((local_238.d[3] == 0 && local_238.d[1] == 0) &&
           (local_238.d[2] == 0 && local_238.d[0] == 0))))) goto LAB_00110214;
      secp256k1_scalar_set_b32(r_02 + 0x10,puVar26 + 0xc1,(int *)&local_2b8);
      uVar28 = local_2d8;
      if (((int)local_2b8.d[0] != 0) ||
         (auVar37._0_4_ = -(uint)((int)r_02[0x10].d[2] == 0 && (int)r_02[0x10].d[0] == 0),
         auVar37._4_4_ =
              -(uint)(*(int *)((long)r_02[0x10].d + 0x14) == 0 &&
                     *(int *)((long)r_02[0x10].d + 4) == 0),
         auVar37._8_4_ = -(uint)((int)r_02[0x10].d[3] == 0 && (int)r_02[0x10].d[1] == 0),
         auVar37._12_4_ =
              -(uint)(*(int *)((long)r_02[0x10].d + 0x1c) == 0 &&
                     *(int *)((long)r_02[0x10].d + 0xc) == 0),
         iVar8 = movmskps(extraout_EAX_03,auVar37), iVar8 == 0xf)) goto LAB_00110214;
      psVar17 = &local_98;
      psVar21 = r_02 + 8;
      for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
        psVar21->d[0] = *(uint64_t *)psVar17->s;
        psVar17 = (secp256k1_sha256 *)((long)psVar17 + ((ulong)bVar30 * -2 + 1) * 8);
        psVar21 = (secp256k1_scalar *)((long)psVar21 + ((ulong)bVar30 * -2 + 1) * 8);
      }
      puVar10 = (uint64_t *)local_120;
      puVar19 = r_02[10].d + 3;
      for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
        *puVar19 = *puVar10;
        puVar10 = puVar10 + (ulong)bVar30 * -2 + 1;
        puVar19 = puVar19 + (ulong)bVar30 * -2 + 1;
      }
      r_02[0xd].d[2] = local_2d8;
      r_02[0xd].d[3] = 0;
      r_02[0x11].d[0] = (uint64_t)(value_gen + sVar13);
      if (min_value == (uint64_t **)0x0) {
        puVar10 = (uint64_t *)0x0;
      }
      else {
        puVar10 = min_value[sVar13];
      }
      r_02[0x11].d[2] = (uint64_t)puVar10;
      r_02[0x11].d[1] = (uint64_t)commitp[sVar13];
      r_02[0x11].d[3] = n_commits;
      secp256k1_scalar_mul(&local_268,&local_268,psVar18);
      secp256k1_scalar_add(&local_238,&local_238,&local_268);
      lVar9 = sVar13 * 0x80;
      *(uchar **)((long)local_318 + lVar9) = (uchar *)local_310->d[sVar13] + 0xc1;
      puVar10 = (uint64_t *)((long)local_318 + lVar9 + 0x18);
      *puVar10 = local_238.d[2];
      puVar10[1] = local_238.d[3];
      puVar10 = (uint64_t *)((long)local_318 + lVar9 + 8);
      *puVar10 = local_238.d[0];
      puVar10[1] = local_238.d[1];
      puVar2 = (undefined8 *)((long)local_318 + lVar9 + 0x48);
      *puVar2 = local_298._0_8_;
      puVar2[1] = local_298._8_8_;
      puVar2 = (undefined8 *)((long)local_318 + lVar9 + 0x58);
      *puVar2 = local_288._0_8_;
      puVar2[1] = local_288._8_8_;
      uVar5 = r_02->d[0];
      uVar6 = r_02->d[1];
      uVar7 = r_02->d[3];
      puVar10 = (uint64_t *)((long)local_318 + lVar9 + 0x38);
      *puVar10 = r_02->d[2];
      puVar10[1] = uVar7;
      puVar10 = (uint64_t *)((long)local_318 + lVar9 + 0x28);
      *puVar10 = uVar5;
      puVar10[1] = uVar6;
      *(code **)((long)local_318 + lVar9 + 0x68) = secp256k1_bulletproof_rangeproof_vfy_callback;
      *(secp256k1_scalar **)((long)local_318 + lVar9 + 0x70) = r_02;
      *(ulong *)((long)local_318 + lVar9 + 0x78) = local_2e8;
      sVar13 = sVar13 + 1;
    } while (sVar13 != local_2c8);
    bVar4 = false;
  }
  sVar20 = local_2f0 - 0xc1;
  local_2f8 = (secp256k1_scalar *)0x0;
  bVar29 = (int)local_308 != 0;
  sVar15 = secp256k1_bulletproof_innerproduct_proof_length(uVar28);
  sVar13 = local_2c8;
  psVar24 = local_328;
  local_2f0 = sVar20;
  if (sVar15 != sVar20 || bVar4) {
    uVar14 = (uint)(sVar15 == sVar20);
    goto LAB_00110c59;
  }
  iVar8 = secp256k1_scratch_allocate_frame(local_328,local_2c8 * 0x10d0,2);
  if (iVar8 == 0) {
LAB_00110c57:
    uVar14 = 0;
    goto LAB_00110c59;
  }
  local_300 = (void *)(uVar28 * 2);
  local_2f8 = (secp256k1_scalar *)CONCAT71((int7)((ulong)local_2f8 >> 8),bVar29);
  local_120._0_8_ = sVar13;
  local_f8 = gens->blinding_gen;
  local_f0 = gens->gens;
  local_e8 = local_f0 + (gens->n >> 1);
  if (local_300 < (void *)0x24) {
    local_d8 = *(secp256k1_scalar **)(&DAT_0012f4a0 + ((ulong)local_300 >> 2) * 8);
  }
  else {
    local_d8 = (secp256k1_scalar *)0x0;
    uVar27 = (ulong)local_300 >> 2;
    do {
      local_d8 = (secp256k1_scalar *)((long)local_d8->d + 1);
      bVar4 = 3 < uVar27;
      uVar27 = uVar27 >> 1;
    } while (bVar4);
  }
  local_d0 = (int)local_308;
  sVar15 = psVar24->frame;
  local_2d8 = uVar28;
  local_e0 = uVar28;
  if (sVar15 == 0) {
    local_c8 = (void *)0x0;
    pvVar23 = (void *)0x0;
  }
  else {
    sVar25 = sVar13 * 0x20;
    pvVar23 = psVar24->data[sVar15 + 4];
    pvVar16 = (void *)psVar24->offset[sVar15 + 4];
    if (pvVar16 < (void *)((long)pvVar23 + sVar25)) {
      local_c8 = (void *)0x0;
    }
    else {
      pvVar16 = (void *)((long)pvVar23 + (long)psVar24->data[sVar15 - 1]);
      pvVar23 = (void *)0x0;
      memset(pvVar16,0,sVar25);
      psVar24->data[sVar15 + 4] = (void *)((long)psVar24->data[sVar15 + 4] + sVar25);
      sVar15 = psVar24->frame;
      local_c8 = pvVar16;
      if (sVar15 == 0) goto LAB_00110424;
      pvVar23 = psVar24->data[sVar15 + 4];
      pvVar16 = (void *)psVar24->offset[sVar15 + 4];
    }
    sVar25 = sVar13 * 0x10b0;
    if (pvVar16 < (void *)((long)pvVar23 + sVar25)) {
      pvVar23 = (void *)0x0;
    }
    else {
      pvVar23 = (void *)((long)pvVar23 + (long)psVar24->data[sVar15 - 1]);
      memset(pvVar23,0,sVar25);
      psVar24->offset[sVar15 - 1] = psVar24->offset[sVar15 - 1] + sVar25;
    }
  }
LAB_00110424:
  sVar20 = local_2f0;
  sVar15 = (long)local_2f8 + local_2d8 * 2 + 1;
  local_2f8 = (secp256k1_scalar *)-(long)local_2f8;
  local_98.s[0] = 0x6a09e667;
  local_98.s[1] = 0xbb67ae85;
  local_98.s[2] = 0x3c6ef372;
  local_98.s[3] = 0xa54ff53a;
  local_98.s[4] = 0x510e527f;
  local_98.s[5] = 0x9b05688c;
  local_98.s[6] = 0x1f83d9ab;
  local_98.s[7] = 0x5be0cd19;
  local_98.bytes = 0;
  puVar26 = (uchar *)((long)local_318 + 0x48);
  local_c0 = pvVar23;
  do {
    secp256k1_sha256_write(&local_98,*(uchar **)(puVar26 + -0x48),sVar20);
    secp256k1_sha256_write(&local_98,puVar26,0x20);
    secp256k1_scalar_get_b32(local_218,(secp256k1_scalar *)(puVar26 + -0x40));
    secp256k1_sha256_write(&local_98,local_218,0x20);
    puVar26 = puVar26 + 0x80;
    sVar13 = sVar13 - 1;
  } while (sVar13 != 0);
  secp256k1_sha256_finalize(&local_98,local_218);
  local_108 = 0;
  uStack_100 = 0;
  local_120._8_8_ = 0;
  uStack_110 = 0;
  local_140 = (void *)0x4;
  if (local_300 < (void *)0x4) {
    local_140 = local_300;
  }
  local_2e8 = (ulong)local_140 >> 1 & 0x7fffffff;
  local_138 = (secp256k1_scalar *)((long)local_1e8.x.n + (ulong)(uint)((int)local_2e8 << 5));
  local_148 = (long)local_140 - 1;
  local_150 = (long)local_140 * 0x20 + -0x20;
  local_308 = local_1e8.x.n + (long)local_140 * 4 + -4;
  local_130 = (long)local_140 + (ulong)(local_140 == (void *)0x0);
  local_2e0 = (ulong)(uint)((int)local_140 << 5);
  local_158 = (secp256k1_scalar *)(local_218 + local_2e0 + 0x10);
  local_2e0 = local_2e0 - 0x38;
  local_2f0 = 0x88;
  sVar13 = 0;
  do {
    pvVar23 = local_318;
    lVar12 = sVar15 + (long)local_2f8;
    lVar22 = sVar13 * 0x80;
    puVar26 = *(uchar **)((long)local_318 + lVar22);
    local_270 = local_d8;
    lVar9 = *(long *)((long)local_318 + lVar22 + 0x78);
    secp256k1_scalar_set_b32((secp256k1_scalar *)local_b8,puVar26,&local_32c);
    if (local_32c != 0) {
LAB_00110c3c:
      psVar24 = local_328;
      sVar13 = local_328->frame;
      local_328->frame = sVar13 - 1;
      free(local_328->data[sVar13 - 1]);
      goto LAB_00110c57;
    }
    pvVar23 = (void *)(lVar22 + (long)pvVar23);
    local_98.s[0] = 0x6a09e667;
    local_98.s[1] = 0xbb67ae85;
    local_98.s[2] = 0x3c6ef372;
    local_98.s[3] = 0xa54ff53a;
    local_98.s[4] = 0x510e527f;
    local_98.s[5] = 0x9b05688c;
    local_98.s[6] = 0x1f83d9ab;
    local_98.s[7] = 0x5be0cd19;
    local_98.bytes = 0;
    local_2d0 = sVar13;
    local_278 = lVar12 + lVar9;
    secp256k1_sha256_write(&local_98,(uchar *)((long)pvVar23 + 0x48),0x20);
    secp256k1_sha256_write(&local_98,puVar26,0x20);
    secp256k1_sha256_finalize(&local_98,local_298);
    uVar27 = local_2e8;
    psVar18 = (secp256k1_scalar *)(puVar26 + 0x20);
    if (local_300 != (void *)0x0) {
      r_03 = &local_1e8;
      lVar9 = local_130;
      do {
        secp256k1_scalar_set_b32((secp256k1_scalar *)r_03,(uchar *)psVar18,&local_32c);
        if ((local_32c != 0) ||
           (auVar31._0_4_ = -(uint)((int)(r_03->x).n[0] == 0 && (int)(r_03->x).n[2] == 0),
           auVar31._4_4_ =
                -(uint)(*(int *)((long)(r_03->x).n + 4) == 0 &&
                       *(int *)((long)(r_03->x).n + 0x14) == 0),
           auVar31._8_4_ = -(uint)((int)(r_03->x).n[1] == 0 && (int)(r_03->x).n[3] == 0),
           auVar31._12_4_ =
                -(uint)(*(int *)((long)(r_03->x).n + 0xc) == 0 &&
                       *(int *)((long)(r_03->x).n + 0x1c) == 0),
           iVar8 = movmskps(extraout_EAX_04,auVar31), iVar8 == 0xf)) goto LAB_00110c3c;
        psVar18 = psVar18 + 1;
        r_03 = (secp256k1_gej *)((r_03->x).n + 4);
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    local_2c0 = psVar18;
    secp256k1_scalar_dot_product(&local_268,(secp256k1_scalar *)&local_1e8,local_138,uVar27);
    sVar13 = local_2d0;
    local_240 = local_2d0 * 0x10b0;
    *(void **)((long)local_c0 + local_240) = pvVar23;
    local_98.s[0] = 0x6a09e667;
    local_98.s[1] = 0xbb67ae85;
    local_98.s[2] = 0x3c6ef372;
    local_98.s[3] = 0xa54ff53a;
    local_98.s[4] = 0x510e527f;
    local_98.s[5] = 0x9b05688c;
    local_98.s[6] = 0x1f83d9ab;
    local_98.s[7] = 0x5be0cd19;
    local_98.bytes = 0;
    secp256k1_sha256_write(&local_98,local_218,0x20);
    secp256k1_sha256_finalize(&local_98,local_218);
    lVar9 = sVar13 * 0x20;
    psVar18 = (secp256k1_scalar *)((long)local_c8 + lVar9);
    secp256k1_scalar_set_b32(psVar18,local_218,&local_32c);
    if ((((local_32c != 0) ||
         (auVar38._0_4_ = -(uint)((int)psVar18->d[2] == 0 && (int)psVar18->d[0] == 0),
         auVar38._4_4_ =
              -(uint)(*(int *)((long)psVar18->d + 0x14) == 0 && *(int *)((long)psVar18->d + 4) == 0)
         , auVar38._8_4_ = -(uint)((int)psVar18->d[3] == 0 && (int)psVar18->d[1] == 0),
         auVar38._12_4_ =
              -(uint)(*(int *)((long)psVar18->d + 0x1c) == 0 &&
                     *(int *)((long)psVar18->d + 0xc) == 0),
         iVar8 = movmskps(extraout_EAX_05,auVar38), iVar8 == 0xf)) ||
        (secp256k1_scalar_set_b32(&local_238,local_298,&local_32c), local_32c != 0)) ||
       ((local_238.d[3] == 0 && local_238.d[1] == 0) && (local_238.d[2] == 0 && local_238.d[0] == 0)
       )) goto LAB_00110c3c;
    secp256k1_scalar_negate(&local_268,&local_268);
    secp256k1_scalar_add(&local_268,&local_268,(secp256k1_scalar *)local_b8);
    secp256k1_scalar_mul(&local_238,&local_238,&local_268);
    secp256k1_scalar_add(&local_238,&local_238,(secp256k1_scalar *)((long)pvVar23 + 8));
    secp256k1_scalar_mul(&local_238,&local_238,psVar18);
    iVar8 = secp256k1_scalar_add
                      ((secp256k1_scalar *)(local_120 + 8),(secp256k1_scalar *)(local_120 + 8),
                       &local_238);
    pvVar23 = local_c0;
    if (local_300 < (void *)0x5) {
      auVar32._0_4_ = -(uint)((int)local_268.d[2] == 0 && (int)local_268.d[0] == 0);
      auVar32._4_4_ = -(uint)(local_268.d[2]._4_4_ == 0 && local_268.d[0]._4_4_ == 0);
      auVar32._8_4_ = -(uint)((int)local_268.d[3] == 0 && (int)local_268.d[1] == 0);
      auVar32._12_4_ = -(uint)(local_268.d[3]._4_4_ == 0 && local_268.d[1]._4_4_ == 0);
      iVar8 = movmskps(iVar8,auVar32);
      if (iVar8 != 0xf) goto LAB_00110c3c;
      if (local_2d8 != 0) goto LAB_001108a5;
    }
    else {
LAB_001108a5:
      *(secp256k1_scalar **)((long)local_c0 + local_240 + 0x10a8) = local_2c0;
      local_268.d[0] = *local_308;
      local_268.d[1] = local_308[1];
      local_268.d[2] = local_308[2];
      local_268.d[3] = local_308[3];
      uVar28 = *(uint64_t *)((long)local_c8 + lVar9);
      uVar5 = ((uint64_t *)((long)local_c8 + lVar9))[1];
      puVar10 = (uint64_t *)((long)local_c8 + lVar9 + 0x10);
      uVar6 = puVar10[1];
      local_160 = lVar9;
      local_308[2] = *puVar10;
      local_308[3] = uVar6;
      *local_308 = uVar28;
      local_308[1] = uVar5;
      if (local_d8 != (secp256k1_scalar *)0x0) {
        puVar26 = (uchar *)((long)local_2c0->d + ((long)local_d8 * 2 + 7U >> 3));
        psVar18 = (secp256k1_scalar *)(local_2f0 + (long)pvVar23);
        uVar27 = 0;
        psVar21 = local_d8;
        do {
          bVar30 = *(byte *)((long)local_2c0->d + (uVar27 >> 3));
          local_319 = (bVar30 >> ((int)uVar27 + 1U & 7) & 1) != 0 |
                      (bVar30 >> ((byte)uVar27 & 6)) * '\x02' & 2;
          local_98.s[0] = 0x6a09e667;
          local_98.s[1] = 0xbb67ae85;
          local_98.s[2] = 0x3c6ef372;
          local_98.s[3] = 0xa54ff53a;
          local_98.s[4] = 0x510e527f;
          local_98.s[5] = 0x9b05688c;
          local_98.s[6] = 0x1f83d9ab;
          local_98.s[7] = 0x5be0cd19;
          local_98.bytes = 0;
          local_310 = psVar21;
          secp256k1_sha256_write(&local_98,local_298,0x20);
          secp256k1_sha256_write(&local_98,&local_319,1);
          secp256k1_sha256_write(&local_98,puVar26,0x20);
          secp256k1_sha256_write(&local_98,puVar26 + 0x20,0x20);
          secp256k1_sha256_finalize(&local_98,local_298);
          secp256k1_scalar_set_b32(&local_2b8,local_298,&local_32c);
          if ((local_32c != 0) ||
             ((local_2b8.d[3] == 0 && local_2b8.d[1] == 0) &&
              (local_2b8.d[2] == 0 && CONCAT44(local_2b8.d[0]._4_4_,(int)local_2b8.d[0]) == 0)))
          goto LAB_00110c3c;
          secp256k1_scalar_mul
                    ((secp256k1_scalar *)local_308,(secp256k1_scalar *)local_308,&local_2b8);
          secp256k1_scalar_sqr(psVar18,&local_2b8);
          psVar18 = psVar18 + 1;
          puVar26 = puVar26 + 0x40;
          uVar27 = uVar27 + 2;
          psVar21 = (secp256k1_scalar *)((long)local_310[-1].d + 0x1f);
        } while (psVar21 != (secp256k1_scalar *)0x0);
      }
      lVar9 = local_240;
      psVar21 = (secp256k1_scalar *)((long)pvVar23 + local_240 + 8);
      secp256k1_scalar_inverse_all_var(psVar21,(secp256k1_scalar *)&local_1e8,(size_t)local_140);
      local_308[2] = local_268.d[2];
      local_308[3] = local_268.d[3];
      *local_308 = local_268.d[0];
      local_308[1] = local_268.d[1];
      psVar18 = (secp256k1_scalar *)((long)pvVar23 + lVar9 + 0x1088);
      secp256k1_scalar_negate(psVar18,psVar21);
      local_310 = psVar18;
      secp256k1_scalar_mul
                (psVar18,psVar18,(secp256k1_scalar *)((long)pvVar23 + local_150 + lVar9 + 8));
      uVar27 = local_2e8;
      psVar21 = (secp256k1_scalar *)((long)pvVar23 + local_2e0);
      uVar11 = local_148;
      psVar18 = local_158;
      do {
        uVar1 = uVar11 - 1;
        if (uVar27 == uVar11) {
          uVar11 = 0xffffffffffffffff;
        }
        secp256k1_scalar_mul
                  (psVar21,(secp256k1_scalar *)((long)pvVar23 + (uVar11 & uVar1) * 0x20 + lVar9 + 8)
                   ,psVar18);
        psVar18 = psVar18 + -1;
        psVar21 = psVar21 + -1;
        uVar11 = uVar1;
      } while (uVar1 != 0);
      secp256k1_scalar_mul
                (&local_268,(secp256k1_scalar *)(local_160 + (long)local_c8),
                 (secp256k1_scalar *)&local_1e8);
      secp256k1_scalar_sqr(&local_268,&local_268);
      secp256k1_scalar_mul((secp256k1_scalar *)((long)pvVar23 + lVar9 + 0xc88),local_310,&local_268)
      ;
    }
    psVar24 = local_328;
    sVar15 = local_278 + (long)local_270 * 2;
    sVar13 = local_2d0 + 1;
    local_2f0 = local_2f0 + 0x10b0;
    local_2e0 = local_2e0 + 0x10b0;
  } while (sVar13 != local_2c8);
  iVar8 = secp256k1_ecmult_multi_var
                    (local_128,local_328,&local_1e8,(secp256k1_scalar *)0x0,
                     secp256k1_bulletproof_innerproduct_vfy_ecmult_callback,local_120,sVar15);
  sVar13 = psVar24->frame;
  psVar24->frame = sVar13 - 1;
  free(psVar24->data[sVar13 - 1]);
  uVar14 = 0;
  if (iVar8 == 1) {
    uVar14 = local_1e8.infinity;
  }
LAB_00110c59:
  sVar13 = psVar24->frame;
  psVar24->frame = sVar13 - 1;
  free(psVar24->data[sVar13 - 1]);
  return uVar14;
}

Assistant:

static int secp256k1_bulletproof_rangeproof_verify_impl(const secp256k1_ecmult_context *ecmult_ctx, secp256k1_scratch *scratch, const unsigned char* const* proof, const size_t n_proofs, const size_t plen, size_t nbits, const uint64_t* const* min_value, const secp256k1_ge* const* commitp, size_t n_commits, const secp256k1_ge *value_gen, const secp256k1_bulletproof_generators *gens, const unsigned char* const* extra_commit, size_t *extra_commit_len) {
    secp256k1_bulletproof_vfy_ecmult_context *ecmult_data;
    secp256k1_bulletproof_innerproduct_context *innp_ctx;
    int ret;
    size_t i;
    int same_generators = 1;

    /* sanity-check input */
    if (secp256k1_popcountl(nbits) != 1 || nbits > MAX_NBITS) {
        return 0;
    }
    if (plen < 64 + 128 + 1 + 32) {  /* inner product argument will do a more precise check */
        return 0;
    }
    if (plen > SECP256K1_BULLETPROOF_MAX_PROOF) {
        return 0;
    }

    if (!secp256k1_scratch_allocate_frame(scratch, n_proofs * (sizeof(*ecmult_data) + sizeof(*innp_ctx)), 2)) {
        return 0;
    }
    ecmult_data = (secp256k1_bulletproof_vfy_ecmult_context *)secp256k1_scratch_alloc(scratch, n_proofs * sizeof(*ecmult_data));
    innp_ctx = (secp256k1_bulletproof_innerproduct_context *)secp256k1_scratch_alloc(scratch, n_proofs * sizeof(*innp_ctx));

    /* Check if all generators are equal. If so, we can amortize all their scalar multiplications
     * by them and save one scalar-ge multiplication per proof. */
    VERIFY_CHECK(!secp256k1_ge_is_infinity(&value_gen[0]));
    for (i = 1; i < n_proofs; i++) {
        VERIFY_CHECK(!secp256k1_ge_is_infinity(&value_gen[i]));
        if (!secp256k1_fe_equal_var(&value_gen[i].x, &value_gen[i - 1].x) ||
            !secp256k1_fe_equal_var(&value_gen[i].y, &value_gen[i - 1].y)) {
            same_generators = 0;
        }
    }

    for (i = 0; i < n_proofs; i++) {
        secp256k1_sha256 sha256;
        unsigned char commit[32] = {0};
        unsigned char randomizer61[32] = {0};  /* randomizer for eq (61) so we can add it to eq (62) to save a separate multiexp */
        secp256k1_scalar taux, mu;
        secp256k1_ge age, sge;
        int overflow;
        size_t j;

        /* Commit to all input data: min value, pedersen commit, asset generator, extra_commit */
        if (min_value != NULL && min_value[i] != NULL) {
            unsigned char len[4];
            secp256k1_sha256_initialize(&sha256);
            secp256k1_sha256_write(&sha256, commit, 32);
            len[0] = n_commits;
            len[1] = n_commits >> 8;
            len[2] = n_commits >> 16;
            len[3] = n_commits >> 24;
            secp256k1_sha256_write(&sha256, len, 4);
            for (j = 0; j < n_commits; j++) {
                unsigned char vbuf[8];
                vbuf[0] = min_value[i][j];
                vbuf[1] = min_value[i][j] >> 8;
                vbuf[2] = min_value[i][j] >> 16;
                vbuf[3] = min_value[i][j] >> 24;
                vbuf[4] = min_value[i][j] >> 32;
                vbuf[5] = min_value[i][j] >> 40;
                vbuf[6] = min_value[i][j] >> 48;
                vbuf[7] = min_value[i][j] >> 56;
                secp256k1_sha256_write(&sha256, vbuf, 8);
            }
            secp256k1_sha256_finalize(&sha256, commit);
        }
        for (j = 0; j < n_commits; j++) {
            secp256k1_bulletproof_update_commit(commit, &commitp[i][j], &value_gen[i]);
        }
        if (extra_commit != NULL && extra_commit[i] != NULL) {
            secp256k1_sha256_initialize(&sha256);
            secp256k1_sha256_write(&sha256, commit, 32);
            secp256k1_sha256_write(&sha256, extra_commit[i], extra_commit_len[i]);
            secp256k1_sha256_finalize(&sha256, commit);
        }

        /* Compute y, z, x */
        if (!secp256k1_bulletproof_deserialize_point(&age, &proof[i][64], 0, 4) ||
            !secp256k1_bulletproof_deserialize_point(&sge, &proof[i][64], 1, 4)) {
            return 0;
        }

        secp256k1_bulletproof_update_commit(commit, &age, &sge);
        secp256k1_scalar_set_b32(&ecmult_data[i].y, commit, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].y)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }
        secp256k1_bulletproof_update_commit(commit, &age, &sge);
        secp256k1_scalar_set_b32(&ecmult_data[i].z, commit, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].z)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }

        if (!secp256k1_bulletproof_deserialize_point(&ecmult_data[i].t1, &proof[i][64], 2, 4) ||
            !secp256k1_bulletproof_deserialize_point(&ecmult_data[i].t2, &proof[i][64], 3, 4)) {
            return 0;
        }

        secp256k1_bulletproof_update_commit(commit, &ecmult_data[i].t1, &ecmult_data[i].t2);
        secp256k1_scalar_set_b32(&ecmult_data[i].x, commit, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].x)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }

        /* compute exponent offsets */
        secp256k1_scalar_inverse_var(&ecmult_data[i].yinv, &ecmult_data[i].y);  /* TODO somehow batch this w the inner-product argument inverse */
        ecmult_data[i].yinvn = ecmult_data[i].yinv;
        for (j = 0; j < secp256k1_floor_lg(nbits); j++) {
            secp256k1_scalar_sqr(&ecmult_data[i].yinvn, &ecmult_data[i].yinvn);
        }
        secp256k1_scalar_sqr(&ecmult_data[i].zsq, &ecmult_data[i].z);
        secp256k1_scalar_negate(&ecmult_data[i].negz, &ecmult_data[i].z);

        /* Update commit with remaining data for the inner product proof */
        secp256k1_sha256_initialize(&sha256);
        secp256k1_sha256_write(&sha256, commit, 32);
        secp256k1_sha256_write(&sha256, &proof[i][0], 64);
        secp256k1_sha256_finalize(&sha256, commit);

        secp256k1_sha256_initialize(&sha256);
        secp256k1_sha256_write(&sha256, commit, 32);
        secp256k1_sha256_finalize(&sha256, randomizer61);
        secp256k1_scalar_set_b32(&ecmult_data[i].randomizer61, randomizer61, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].randomizer61)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }

        /* Deserialize everything else */
        secp256k1_scalar_set_b32(&taux, &proof[i][0], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&taux)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }
        secp256k1_scalar_set_b32(&mu, &proof[i][32], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&mu)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }
        /* A little sketchy, we read t (l(x) . r(x)) off the front of the inner product proof,
         * which we otherwise treat as a black box */
        secp256k1_scalar_set_b32(&ecmult_data[i].t, &proof[i][64 + 128 + 1], &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ecmult_data[i].t)) {
            secp256k1_scratch_deallocate_frame(scratch);
            return 0;
        }

        /* Verify inner product proof */
        ecmult_data[i].a = age;
        ecmult_data[i].s = sge;
        ecmult_data[i].n = nbits * n_commits;
        ecmult_data[i].count = 0;
        ecmult_data[i].asset = &value_gen[i];
        ecmult_data[i].min_value = min_value == NULL ? NULL : min_value[i];
        ecmult_data[i].commit = commitp[i];
        ecmult_data[i].n_commits = n_commits;
        secp256k1_scalar_mul(&taux, &taux, &ecmult_data[i].randomizer61);
        secp256k1_scalar_add(&mu, &mu, &taux);

        innp_ctx[i].proof = &proof[i][64 + 128 + 1];
        innp_ctx[i].p_offs = mu;
        memcpy(innp_ctx[i].commit, commit, 32);
        innp_ctx[i].yinv = ecmult_data[i].yinv;
        innp_ctx[i].rangeproof_cb = secp256k1_bulletproof_rangeproof_vfy_callback;
        innp_ctx[i].rangeproof_cb_data = (void *) &ecmult_data[i];
        innp_ctx[i].n_extra_rangeproof_points = 5 + n_commits;
    }

    ret = secp256k1_bulletproof_inner_product_verify_impl(ecmult_ctx, scratch, gens, nbits * n_commits, innp_ctx, n_proofs, plen - (64 + 128 + 1), same_generators);
    secp256k1_scratch_deallocate_frame(scratch);
    return ret;
}